

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign.c
# Opt level: O0

int RSA_sign(int type,uchar *m,uint m_length,uchar *sigret,uint *siglen,RSA *rsa)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uchar *encoded;
  uchar *tmps;
  size_t encoded_len;
  int ret;
  int encrypt_len;
  undefined8 in_stack_ffffffffffffffa8;
  uchar *from;
  uchar *num;
  char *file;
  int iVar5;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  iVar5 = 0;
  file = (char *)0x0;
  num = (uchar *)0x0;
  from = (uchar *)0x0;
  if (*(long *)(rsa->engine + 0x58) != 0) {
    iVar1 = (**(code **)(rsa->engine + 0x58))(type,m,m_length,sigret,siglen,rsa);
    return iVar1;
  }
  if (type == 0x72) {
    if (m_length != 0x24) {
      ERR_new();
      ERR_set_debug(file,(int)((ulong)num >> 0x20),(char *)from);
      ERR_set_error(4,0x83,(char *)0x0);
      return 0;
    }
    file = (char *)0x24;
  }
  else {
    iVar2 = encode_pkcs1((uchar **)CONCAT44(m_length,in_stack_ffffffffffffffe8),(size_t *)sigret,
                         (int)((ulong)siglen >> 0x20),(uchar *)rsa,
                         (ulong)in_stack_ffffffffffffffcc << 0x20);
    m = num;
    if (iVar2 == 0) goto LAB_002c7f46;
  }
  from = m;
  pcVar4 = file + 0xb;
  iVar1 = RSA_size(rsa);
  if ((char *)(long)iVar1 < pcVar4) {
    ERR_new();
    iVar1 = (int)((ulong)pcVar4 >> 0x20);
    ERR_set_debug(file,(int)((ulong)num >> 0x20),(char *)from);
    ERR_set_error(4,0x70,(char *)0x0);
  }
  else {
    uVar3 = RSA_private_encrypt((int)file,from,sigret,rsa,1);
    iVar1 = (int)((ulong)pcVar4 >> 0x20);
    if (0 < (int)uVar3) {
      *siglen = uVar3;
      iVar5 = 1;
    }
  }
LAB_002c7f46:
  CRYPTO_clear_free(file,(size_t)num,(char *)from,iVar1);
  return iVar5;
}

Assistant:

int RSA_sign(int type, const unsigned char *m, unsigned int m_len,
             unsigned char *sigret, unsigned int *siglen, RSA *rsa)
{
    int encrypt_len, ret = 0;
    size_t encoded_len = 0;
    unsigned char *tmps = NULL;
    const unsigned char *encoded = NULL;

#ifndef FIPS_MODULE
    if (rsa->meth->rsa_sign != NULL)
        return rsa->meth->rsa_sign(type, m, m_len, sigret, siglen, rsa);
#endif /* FIPS_MODULE */

    /* Compute the encoded digest. */
    if (type == NID_md5_sha1) {
        /*
         * NID_md5_sha1 corresponds to the MD5/SHA1 combination in TLS 1.1 and
         * earlier. It has no DigestInfo wrapper but otherwise is
         * RSASSA-PKCS1-v1_5.
         */
        if (m_len != SSL_SIG_LENGTH) {
            ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_MESSAGE_LENGTH);
            return 0;
        }
        encoded_len = SSL_SIG_LENGTH;
        encoded = m;
    } else {
        if (!encode_pkcs1(&tmps, &encoded_len, type, m, m_len))
            goto err;
        encoded = tmps;
    }

    if (encoded_len + RSA_PKCS1_PADDING_SIZE > (size_t)RSA_size(rsa)) {
        ERR_raise(ERR_LIB_RSA, RSA_R_DIGEST_TOO_BIG_FOR_RSA_KEY);
        goto err;
    }
    encrypt_len = RSA_private_encrypt((int)encoded_len, encoded, sigret, rsa,
                                      RSA_PKCS1_PADDING);
    if (encrypt_len <= 0)
        goto err;

    *siglen = encrypt_len;
    ret = 1;

err:
    OPENSSL_clear_free(tmps, encoded_len);
    return ret;
}